

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_c.h
# Opt level: O3

void __thiscall
dlib::
queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::dequeue(queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
          *this,T *item)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  fatal_error *this_00;
  ostringstream dlib_o_out;
  string local_1b0;
  undefined1 local_190 [376];
  
  iVar1 = (*(this->
            super_queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            ).
            super_enumerable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._vptr_enumerable[8])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::dequeue(&this->
               super_queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
              ,item);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\nError detected at line ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,0x49);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../gui_core/../threads/../queue/queue_kernel_c.h"
             ,0x89);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "void dlib::queue_kernel_c<dlib::queue_kernel_1<std::basic_string<char>>>::dequeue(T &) [queue_base = dlib::queue_kernel_1<std::basic_string<char>>]"
             ,0x93);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"this->size() != 0",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
       *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\tvoid queue::dequeue",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\tsize of queue should not be zero",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n\tthis: ",8);
  poVar2 = std::ostream::_M_insert<void_const*>(local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

void queue_kernel_c<queue_base>::
    dequeue (
        T& item
    )
    {

        // make sure requires clause is not broken
        DLIB_CASSERT(this->size() != 0,
            "\tvoid queue::dequeue"
            << "\n\tsize of queue should not be zero"
            << "\n\tthis: " << this
            );

        // call the real function
        queue_base::dequeue(item);

    }